

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExFreakOperator.cpp
# Opt level: O0

void __thiscall lts2::ExFreakOperator::initWithPatchSize(ExFreakOperator *this,Size *patchSize)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  ulong uVar3;
  IntegratingCell *pIVar4;
  BasisFunction *pBVar5;
  float fVar6;
  int local_9c;
  uint local_90;
  uint local_8c;
  uint i_1;
  uint k;
  uint j;
  float omega;
  float phi;
  uint ring_1;
  IntegratingCell *p_cells;
  int ring;
  int i;
  float filterSigma [8];
  float ringRadius [8];
  float unitSpace;
  int patchRadius;
  Size *local_18;
  Size *patchSize_local;
  ExFreakOperator *this_local;
  
  local_18 = patchSize;
  patchSize_local = (Size *)this;
  cv::Size_<int>::Size_((Size_<int> *)&unitSpace,patchSize);
  LBDOperator::setPatchSize(&this->super_LBDOperator,(Size *)&unitSpace);
  if ((this->super_LBDOperator)._patchSize.height < (this->super_LBDOperator)._patchSize.width) {
    local_9c = (this->super_LBDOperator)._patchSize.height;
  }
  else {
    local_9c = (this->super_LBDOperator)._patchSize.width;
  }
  fVar6 = ((float)local_9c * 22.0) / 1575.0;
  filterSigma[6] = (float)(local_9c / 0x19);
  filterSigma[7] = fVar6 + filterSigma[6];
  ring = (int)(filterSigma[6] / 2.0);
  i = (int)(filterSigma[7] / 2.0);
  filterSigma[0] = (fVar6 * 3.0 + filterSigma[6]) / 2.0;
  filterSigma[1] = (fVar6 * 6.0 + filterSigma[6]) / 2.0;
  filterSigma[2] = (fVar6 * 10.0 + filterSigma[6]) / 2.0;
  filterSigma[3] = (fVar6 * 15.0 + filterSigma[6]) / 2.0;
  filterSigma[4] = (fVar6 * 21.0 + filterSigma[6]) / 2.0;
  filterSigma[5] = filterSigma[6] / 3.0;
  for (p_cells._4_4_ = 0; p_cells._4_4_ < 8; p_cells._4_4_ = p_cells._4_4_ + 1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ring[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,p_cells._4_4_);
    poVar2 = std::operator<<(poVar2,"] = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,filterSigma[(long)p_cells._4_4_ + 6]);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)(&ring)[p_cells._4_4_]);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  (this->super_LBDOperator)._patternPoints = 0;
  for (p_cells._0_4_ = 0; (int)p_cells < 8; p_cells._0_4_ = (int)p_cells + 1) {
    (this->super_LBDOperator)._patternPoints =
         FREAKS_CELLS_PER_RING[(int)p_cells] + (this->super_LBDOperator)._patternPoints;
  }
  if (((this->super_LBDOperator)._sensitiveCells != (IntegratingCell *)0x0) &&
     (pIVar4 = (this->super_LBDOperator)._sensitiveCells, pIVar4 != (IntegratingCell *)0x0)) {
    operator_delete__(pIVar4);
  }
  auVar1 = ZEXT416((this->super_LBDOperator)._patternPoints) * ZEXT816(0x18);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pIVar4 = (IntegratingCell *)operator_new__(uVar3);
  (this->super_LBDOperator)._sensitiveCells = pIVar4;
  _phi = (this->super_LBDOperator)._sensitiveCells;
  for (omega = 0.0; (uint)omega < 8; omega = (float)((int)omega + 1)) {
    LBDOperator::updateRingCells
              (&this->super_LBDOperator,_phi,FREAKS_CELLS_PER_RING[(uint)omega],
               (float)(&ring)[(uint)omega],filterSigma[(ulong)(uint)omega + 6],
               (float)(6.283185307179586 / (double)FREAKS_CELLS_PER_RING[(uint)omega]),
               (float)((3.141592653589793 / (double)FREAKS_CELLS_PER_RING[(uint)omega]) *
                      (double)(uint)omega));
    _phi = _phi + FREAKS_CELLS_PER_RING[(uint)omega];
  }
  *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc =
       (this->super_LBDOperator)._patternPoints * ((this->super_LBDOperator)._patternPoints - 1) >>
       1;
  if (((this->super_LBDOperator)._basisFunctions != (BasisFunction *)0x0) &&
     (pBVar5 = (this->super_LBDOperator)._basisFunctions, pBVar5 != (BasisFunction *)0x0)) {
    operator_delete__(pBVar5);
  }
  auVar1 = ZEXT416(*(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pBVar5 = (BasisFunction *)operator_new__(uVar3);
  (this->super_LBDOperator)._basisFunctions = pBVar5;
  local_8c = 0;
  for (i_1 = 1; i_1 < (this->super_LBDOperator)._patternPoints; i_1 = i_1 + 1) {
    for (local_90 = 0; local_90 < i_1; local_90 = local_90 + 1) {
      (this->super_LBDOperator)._basisFunctions[local_8c].pos_cell = local_90;
      (this->super_LBDOperator)._basisFunctions[local_8c].neg_cell = i_1;
      local_8c = local_8c + 1;
    }
  }
  return;
}

Assistant:

void lts2::ExFreakOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);
    
    int patchRadius = MIN(_patchSize.width, _patchSize.height);
    
    // Update the filter sizes
    // unit = (smallest_radius - biggest_radius) / 21
    float unitSpace = 22.0f * patchRadius / 1575.f;
    
    float ringRadius[8];
    ringRadius[0] = patchRadius / 25;
    ringRadius[1] = ringRadius[0] + 1  * unitSpace; //
    ringRadius[2] = ringRadius[0] + 3  * unitSpace; //
    ringRadius[3] = ringRadius[0] + 6  * unitSpace; //
    ringRadius[4] = ringRadius[0] + 10 * unitSpace; // 
    ringRadius[5] = ringRadius[0] + 15 * unitSpace; // 
    ringRadius[6] = ringRadius[0] + 21 * unitSpace; //
    ringRadius[7] = 0;                              // Center point
    
    float filterSigma[8];
    filterSigma[0] = ringRadius[0] / 2;
    filterSigma[1] = ringRadius[1] / 2;
    filterSigma[2] = ringRadius[2] / 2;
    filterSigma[3] = ringRadius[3] / 2;
    filterSigma[4] = ringRadius[4] / 2;
    filterSigma[5] = ringRadius[5] / 2;
    filterSigma[6] = ringRadius[6] / 2;
    filterSigma[7] = ringRadius[0] / 3; // Center point

#ifdef DEBUG
    for (int i = 0; i < 8; ++i)
        std::cerr << "ring[" << i << "] = " << ringRadius[i] << " (" << filterSigma[i] << ")" << std::endl;
#endif

    // Create the measurement points
    _patternPoints = 0;
    for (int ring = 0; ring < 8; ++ring)
        _patternPoints += FREAKS_CELLS_PER_RING[ring];
    
    // Reset
    if (_sensitiveCells)
        delete[] _sensitiveCells;
    _sensitiveCells = new lbd::IntegratingCell[_patternPoints];
    
    lbd::IntegratingCell* p_cells = _sensitiveCells;
    for (unsigned int ring = 0; ring < 8; ++ring)
    {
        float phi = M_PI / FREAKS_CELLS_PER_RING[ring] * ring;
        float omega = 2.0 * M_PI / FREAKS_CELLS_PER_RING[ring];
        
        updateRingCells(p_cells, FREAKS_CELLS_PER_RING[ring], filterSigma[ring], 
                        ringRadius[ring], omega, phi);
        
        p_cells += FREAKS_CELLS_PER_RING[ring];
    }
    
    // Create all the possible pairs
    _pairsInUse = _patternPoints*(_patternPoints-1)/2;

    /// TODO : fix this ugly hack by a proper init of _basisFunctions in the superclass
    if (_basisFunctions) 
      delete[] _basisFunctions; 

    _basisFunctions = new lbd::BasisFunction[_pairsInUse];
    for (unsigned int j = 1, k = 0; j < _patternPoints; ++j)
        for (unsigned i = 0; i < j; ++i, ++k)
        {
            _basisFunctions[k].pos_cell = i;
            _basisFunctions[k].neg_cell = j;
        }
}